

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

TRef recff_sbufx_check(jit_State *J,RecordFFData *rd,int arg)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  
  if ((rd->argv[arg].field_4.it >> 0xf == 0x1fff3) &&
     (*(char *)(((ulong)rd->argv[arg].field_4 & 0x7fffffffffff) + 10) == '\x03')) {
    TVar1 = J->base[arg];
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4510000e;
    TVar2 = lj_opt_fold(J);
    TVar3 = lj_ir_kint(J,3);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
    J->needsnap = '\x01';
    return TVar1;
  }
  lj_trace_err(J,LJ_TRERR_BADTYPE);
}

Assistant:

static TRef recff_sbufx_check(jit_State *J, RecordFFData *rd, int arg)
{
  TRef trtype, ud = J->base[arg];
  if (!tvisbuf(&rd->argv[arg])) lj_trace_err(J, LJ_TRERR_BADTYPE);
  trtype = emitir(IRT(IR_FLOAD, IRT_U8), ud, IRFL_UDATA_UDTYPE);
  emitir(IRTGI(IR_EQ), trtype, lj_ir_kint(J, UDTYPE_BUFFER));
  J->needsnap = 1;
  return ud;
}